

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::SectionStats::SectionStats(SectionStats *this,SectionStats *param_1)

{
  size_t sVar1;
  size_t sVar2;
  double dVar3;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_00571e40;
  SectionInfo::SectionInfo(&this->sectionInfo,&param_1->sectionInfo);
  this->missingAssertions = param_1->missingAssertions;
  sVar1 = (param_1->assertions).passed;
  sVar2 = (param_1->assertions).failed;
  dVar3 = param_1->durationInSeconds;
  (this->assertions).failedButOk = (param_1->assertions).failedButOk;
  this->durationInSeconds = dVar3;
  (this->assertions).passed = sVar1;
  (this->assertions).failed = sVar2;
  return;
}

Assistant:

SectionStats( SectionStats const& )              = default;